

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_push_back_iterator(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<int,18446744073709551615ul> *local_68;
  size_type sStack_60;
  undefined8 *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_58 = &local_28;
  local_28 = 0;
  uStack_20 = 0;
  local_50 = 4;
  local_48 = 0;
  local_40 = 4;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_38);
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_58,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_38 = 0x160000000b;
  uStack_30 = 0x2c00000021;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_99);
  uVar1 = local_50 * 2;
  uVar2 = uVar1 - (local_50 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_40 - local_48;
  }
  else {
    uVar3 = (local_40 - local_48) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_40;
  }
  else {
    sStack_60 = local_40 % uVar1;
  }
  first_end.current = sStack_60;
  first_end.parent = (view_pointer)&local_58;
  first_begin.current = uVar3;
  first_begin.parent = (view_pointer)&local_58;
  local_68 = (circular_view<int,18446744073709551615ul> *)&local_58;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x160,"void api_dynamic_suite::dynamic_push_back_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_push_back_iterator()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44 };
    span.push_back(input.begin(), input.end());
    {
        std::vector<int> expect = {11, 22, 33, 44};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}